

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O3

Var Js::JavascriptObject::EntryValueOf(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var pvVar6;
  RecyclableObject *pRVar7;
  int in_stack_00000010;
  CallInfo local_38;
  CallInfo callInfo_local;
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_38 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x27d,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00ce0d32;
    *puVar5 = 0;
  }
  callInfo_local = callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_38);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_38 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x280,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00ce0d32;
    *puVar5 = 0;
  }
  if (((ulong)callInfo_local & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x282,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar3) {
LAB_00ce0d32:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,0);
  BVar4 = JavascriptOperators::IsUndefinedOrNull(pvVar6);
  if (BVar4 == 0) {
    pvVar6 = Arguments::operator[]((Arguments *)&callInfo_local,0);
    pRVar7 = JavascriptOperators::ToObject(pvVar6,pSVar1);
    return pRVar7;
  }
  JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec42,L"Object.prototype.valueOf");
}

Assistant:

Var JavascriptObject::EntryValueOf(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

    // throw a TypeError if TypeId is null or undefined, and apply ToObject to the 'this' value otherwise.
    if (JavascriptOperators::IsUndefinedOrNull(args[0]))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Object.prototype.valueOf"));
    }
    else
    {
        return JavascriptOperators::ToObject(args[0], scriptContext);
    }
}